

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementScroll.cpp
# Opt level: O3

void __thiscall Rml::ElementScroll::DisableScrollbar(ElementScroll *this,Orientation orientation)

{
  Element *pEVar1;
  Property local_78;
  
  if (this->scrollbars[orientation].enabled == true) {
    pEVar1 = this->scrollbars[orientation].element;
    local_78.value.type = NONE;
    Variant::Set(&local_78.value,1);
    local_78.unit = KEYWORD;
    local_78.specificity = -1;
    local_78.definition = (PropertyDefinition *)0x0;
    local_78.parser_index = -1;
    local_78.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_78.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Element::SetProperty(pEVar1,Visibility,&local_78);
    if (local_78.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.source.
                 super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    Variant::~Variant(&local_78.value);
    this->scrollbars[orientation].enabled = false;
    pEVar1 = this->corner;
    if (pEVar1 != (Element *)0x0) {
      local_78.value.type = NONE;
      Variant::Set(&local_78.value,1);
      local_78.unit = KEYWORD;
      local_78.specificity = -1;
      local_78.definition = (PropertyDefinition *)0x0;
      local_78.parser_index = -1;
      local_78.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_78.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      Element::SetProperty(pEVar1,Visibility,&local_78);
      if (local_78.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.source.
                   super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      Variant::~Variant(&local_78.value);
    }
  }
  return;
}

Assistant:

void ElementScroll::DisableScrollbar(Orientation orientation)
{
	if (scrollbars[orientation].enabled)
	{
		scrollbars[orientation].element->SetProperty(PropertyId::Visibility, Property(Style::Visibility::Hidden));
		scrollbars[orientation].enabled = false;

		if (corner)
			corner->SetProperty(PropertyId::Visibility, Property(Style::Visibility::Hidden));
	}
}